

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int analysisLoader(void *pData,int argc,char **argv,char **NotUsed)

{
  char *pcVar1;
  int iVar2;
  Table *pTVar3;
  Index *pIndex;
  tRowcnt *__s;
  ulong n;
  Index fakeIdx;
  Index IStack_c8;
  
  if (argv != (char **)0x0) {
    if (((*argv != (char *)0x0) && (argv[2] != (char *)0x0)) &&
       (pTVar3 = sqlite3FindTable(*pData,*argv,*(char **)((long)pData + 8)), pTVar3 != (Table *)0x0)
       ) {
      pcVar1 = argv[1];
      if (pcVar1 == (char *)0x0) {
        pIndex = (Index *)0x0;
      }
      else if ((*argv == (char *)0x0) || (iVar2 = sqlite3StrICmp(*argv,pcVar1), iVar2 != 0)) {
        pIndex = sqlite3FindIndex(*pData,pcVar1,*(char **)((long)pData + 8));
      }
      else {
        for (pIndex = pTVar3->pIndex;
            (pIndex != (Index *)0x0 && ((*(ushort *)&pIndex->field_0x63 & 3) != 2));
            pIndex = pIndex->pNext) {
        }
      }
      pcVar1 = argv[2];
      if (pIndex == (Index *)0x0) {
        IStack_c8.szIdxRow = pTVar3->szTabRow;
        decodeIntArray(pcVar1,1,(tRowcnt *)0x0,&pTVar3->nRowLogEst,&IStack_c8);
        pTVar3->szTabRow = IStack_c8.szIdxRow;
      }
      else {
        iVar2 = pIndex->nKeyCol + 1;
        if (pIndex->aiRowEst == (tRowcnt *)0x0) {
          n = (ulong)(uint)(iVar2 * 4);
          __s = (tRowcnt *)sqlite3Malloc(n);
          if (__s == (tRowcnt *)0x0) {
            pIndex->aiRowEst = (tRowcnt *)0x0;
            sqlite3OomFault(*pData);
          }
          else {
            memset(__s,0,n);
            pIndex->aiRowEst = __s;
          }
        }
        pIndex->field_0x63 = pIndex->field_0x63 & 0xfb;
        decodeIntArray(pcVar1,iVar2,pIndex->aiRowEst,pIndex->aiRowLogEst,pIndex);
        pIndex->field_0x63 = pIndex->field_0x63 | 0x80;
        if (pIndex->pPartIdxWhere != (Expr *)0x0) {
          return 0;
        }
        pTVar3->nRowLogEst = *pIndex->aiRowLogEst;
      }
      *(byte *)&pTVar3->tabFlags = (byte)pTVar3->tabFlags | 0x10;
    }
  }
  return 0;
}

Assistant:

static int analysisLoader(void *pData, int argc, char **argv, char **NotUsed){
  analysisInfo *pInfo = (analysisInfo*)pData;
  Index *pIndex;
  Table *pTable;
  const char *z;

  assert( argc==3 );
  UNUSED_PARAMETER2(NotUsed, argc);

  if( argv==0 || argv[0]==0 || argv[2]==0 ){
    return 0;
  }
  pTable = sqlite3FindTable(pInfo->db, argv[0], pInfo->zDatabase);
  if( pTable==0 ){
    return 0;
  }
  if( argv[1]==0 ){
    pIndex = 0;
  }else if( sqlite3_stricmp(argv[0],argv[1])==0 ){
    pIndex = sqlite3PrimaryKeyIndex(pTable);
  }else{
    pIndex = sqlite3FindIndex(pInfo->db, argv[1], pInfo->zDatabase);
  }
  z = argv[2];

  if( pIndex ){
    tRowcnt *aiRowEst = 0;
    int nCol = pIndex->nKeyCol+1;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    /* Index.aiRowEst may already be set here if there are duplicate 
    ** sqlite_stat1 entries for this index. In that case just clobber
    ** the old data with the new instead of allocating a new array.  */
    if( pIndex->aiRowEst==0 ){
      pIndex->aiRowEst = (tRowcnt*)sqlite3MallocZero(sizeof(tRowcnt) * nCol);
      if( pIndex->aiRowEst==0 ) sqlite3OomFault(pInfo->db);
    }
    aiRowEst = pIndex->aiRowEst;
#endif
    pIndex->bUnordered = 0;
    decodeIntArray((char*)z, nCol, aiRowEst, pIndex->aiRowLogEst, pIndex);
    pIndex->hasStat1 = 1;
    if( pIndex->pPartIdxWhere==0 ){
      pTable->nRowLogEst = pIndex->aiRowLogEst[0];
      pTable->tabFlags |= TF_HasStat1;
    }
  }else{
    Index fakeIdx;
    fakeIdx.szIdxRow = pTable->szTabRow;
#ifdef SQLITE_ENABLE_COSTMULT
    fakeIdx.pTable = pTable;
#endif
    decodeIntArray((char*)z, 1, 0, &pTable->nRowLogEst, &fakeIdx);
    pTable->szTabRow = fakeIdx.szIdxRow;
    pTable->tabFlags |= TF_HasStat1;
  }

  return 0;
}